

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontTable.cpp
# Opt level: O0

void __thiscall FontTable::writeSettings(FontTable *this,QSettings *settings)

{
  QSettings *pQVar1;
  QVariant *pQVar2;
  QString local_58;
  QVariant local_40;
  int local_1c;
  QSettings *pQStack_18;
  int i;
  QSettings *settings_local;
  FontTable *this_local;
  
  pQStack_18 = settings;
  settings_local = (QSettings *)this;
  QSettings::beginGroup((QString *)settings);
  for (local_1c = 0; pQVar1 = pQStack_18, local_1c < 3; local_1c = local_1c + 1) {
    pQVar2 = (QVariant *)
             std::array<QString,_3UL>::operator[]
                       ((array<QString,_3UL> *)FontTableTU::FontKeys,(long)local_1c);
    std::array<QFont,_3UL>::operator[](&this->mFonts,(long)local_1c);
    QFont::toString();
    QVariant::QVariant(&local_40,(QString *)&local_58);
    QSettings::setValue((QString *)pQVar1,pQVar2);
    QVariant::~QVariant(&local_40);
    QString::~QString(&local_58);
  }
  QSettings::endGroup();
  return;
}

Assistant:

void FontTable::writeSettings(QSettings &settings) const {

    settings.beginGroup(Keys::Fonts);

    for (int i = 0; i < Count; ++i) {
        settings.setValue(TU::FontKeys[i], mFonts[i].toString());
    }

    settings.endGroup();
}